

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader
          (string *__return_storage_ptr__,JobParseT *this,WorkerT *wrk,string *includerDir,
          string *includeBase)

{
  bool bVar1;
  BaseSettingsT *pBVar2;
  MocSettingsT *pMVar3;
  ulong uVar4;
  FileSystem *this_00;
  string local_d0;
  int local_ac;
  undefined1 local_a8 [8];
  string fullPath;
  string *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_31;
  string *local_30;
  string *includeBase_local;
  string *includerDir_local;
  WorkerT *wrk_local;
  JobParseT *this_local;
  string *header;
  
  local_31 = 0;
  local_30 = includeBase;
  includeBase_local = includerDir;
  includerDir_local = (string *)wrk;
  wrk_local = (WorkerT *)this;
  this_local = (JobParseT *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pBVar2 = WorkerT::Base((WorkerT *)includerDir_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 includeBase_local,local_30);
  bVar1 = BaseSettingsT::FindHeader(pBVar2,__return_storage_ptr__,(string *)&__range2);
  std::__cxx11::string::~string((string *)&__range2);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pMVar3 = WorkerT::Moc((WorkerT *)includerDir_local);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pMVar3->IncludePaths);
    path = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pMVar3->IncludePaths);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar1) {
      fullPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_a8,(string *)fullPath.field_2._8_8_);
      std::__cxx11::string::push_back((char)local_a8);
      std::__cxx11::string::operator+=((string *)local_a8,(string *)local_30);
      pBVar2 = WorkerT::Base((WorkerT *)includerDir_local);
      bVar1 = BaseSettingsT::FindHeader(pBVar2,__return_storage_ptr__,(string *)local_a8);
      if (bVar1) {
        local_ac = 2;
      }
      else {
        local_ac = 0;
      }
      std::__cxx11::string::~string((string *)local_a8);
      if (local_ac != 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_00 = WorkerT::FileSys((WorkerT *)includerDir_local);
    cmQtAutoGenerator::FileSystem::GetRealPath(&local_d0,this_00,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader(
  WorkerT& wrk, std::string const& includerDir, std::string const& includeBase)
{
  std::string header;
  // Search in vicinity of the source
  if (!wrk.Base().FindHeader(header, includerDir + includeBase)) {
    // Search in include directories
    for (std::string const& path : wrk.Moc().IncludePaths) {
      std::string fullPath = path;
      fullPath.push_back('/');
      fullPath += includeBase;
      if (wrk.Base().FindHeader(header, fullPath)) {
        break;
      }
    }
  }
  // Sanitize
  if (!header.empty()) {
    header = wrk.FileSys().GetRealPath(header);
  }
  return header;
}